

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

string * __thiscall
t_rs_generator::handler_successful_return_struct_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  t_field *tfield;
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  pointer pptVar4;
  bool bVar5;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  ostringstream return_struct;
  string local_1e8;
  string *local_1c8;
  vector<t_field_*,_std::allocator<t_field_*>_> local_1c0;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  service_call_result_struct_name_abi_cxx11_(&local_1e8,this,tfunc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  iVar1 = (*(tfunc->returntype_->super_t_doc)._vptr_t_doc[4])();
  bVar5 = (char)iVar1 == '\0';
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"result_value: Some(handler_return)",0x22);
  }
  uVar3 = (uint)bVar5;
  if (tfunc->xceptions_ != (t_struct *)0x0) {
    local_1c8 = __return_storage_ptr__;
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              (&local_1c0,&tfunc->xceptions_->members_in_id_order_);
    if (local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pptVar4 = local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        tfield = *pptVar4;
        if (uVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        }
        rust_field_name_abi_cxx11_(&local_1e8,this,tfield);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": None",6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        uVar3 = uVar3 + 1;
        pptVar4 = pptVar4 + 1;
      } while (pptVar4 !=
               local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    __return_storage_ptr__ = local_1c8;
    if (local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_1c8;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," }",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::handler_successful_return_struct(t_function* tfunc) {
  int member_count = 0;
  ostringstream return_struct;

  return_struct << service_call_result_struct_name(tfunc) << " { ";

  // actual return
  if (!tfunc->get_returntype()->is_void()) {
    return_struct << "result_value: Some(handler_return)";
    member_count++;
  }

  // any user-defined exceptions
  if (tfunc->get_xceptions() != nullptr) {
    t_struct* txceptions = tfunc->get_xceptions();
    const vector<t_field*> members = txceptions->get_sorted_members();
    vector<t_field*>::const_iterator members_iter;
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* xception_field = (*members_iter);
      if (member_count > 0) { return_struct << ", "; }
      return_struct << rust_field_name(xception_field) << ": None";
      member_count++;
    }
  }

  return_struct << " }";

  return  return_struct.str();
}